

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O2

void Imf_2_5::anon_unknown_9::fromHalfZigZag_f16c(unsigned_short *src,float *dst)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  auVar1 = *(undefined1 (*) [16])src;
  auVar2 = *(undefined1 (*) [16])(src + 0x38);
  auVar16 = vpsrldq_avx(auVar1,2);
  auVar17 = vpslldq_avx(auVar1,4);
  auVar1 = vpalignr_avx(auVar1,*(undefined1 (*) [16])(src + 0x23),2);
  auVar16 = vpblendw_avx(auVar16,*(undefined1 (*) [16])(src + 0x29),0xfc);
  auVar17 = vpblendw_avx(auVar17,*(undefined1 (*) [16])(src + 0x31),0x1f);
  auVar19 = vpsrldq_avx(auVar2,4);
  auVar20 = vpslldq_avx(auVar2,2);
  auVar2 = vpalignr_avx(*(undefined1 (*) [16])(src + 0x15),auVar2,0xe);
  auVar19 = vpblendw_avx(auVar19,*(undefined1 (*) [16])(src + 7),0xf8);
  auVar20 = vpblendw_avx(auVar20,*(undefined1 (*) [16])(src + 0xf),0x3f);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(src + 6);
  auVar18 = vpinsrq_avx(auVar18,*(undefined8 *)(src + 0x36),1);
  auVar1 = vpshuflw_avx(auVar1,0x1b);
  auVar17 = vpshuflw_avx(auVar17,0x1b);
  auVar19 = vpshuflw_avx(auVar19,0x1b);
  auVar3 = vpshuflw_avx(auVar2,0x1b);
  auVar1 = vpshufhw_avx(auVar1,0x1b);
  auVar2 = vpshufhw_avx(auVar17,0x1b);
  auVar17 = vpshufhw_avx(auVar19,0x1b);
  auVar19 = vpshufhw_avx(auVar3,0x1b);
  auVar1 = vpshufd_avx(auVar1,0x4e);
  auVar2 = vpshufd_avx(auVar2,0x4e);
  auVar17 = vpshufd_avx(auVar17,0x4e);
  auVar19 = vpshufd_avx(auVar19,0x4e);
  auVar3 = vpunpcklwd_avx(auVar1,auVar16);
  auVar4 = vpunpcklwd_avx(auVar2,auVar18);
  auVar5 = vpunpcklwd_avx(auVar17,auVar20);
  auVar6 = vpunpcklwd_avx(auVar19,*(undefined1 (*) [16])(src + 0x1c));
  auVar1 = vpunpckhwd_avx(auVar1,auVar16);
  auVar2 = vpunpckhwd_avx(auVar2,auVar18);
  auVar16 = vpunpckhwd_avx(auVar17,auVar20);
  auVar17 = vpunpckhwd_avx(auVar19,*(undefined1 (*) [16])(src + 0x1c));
  auVar18 = vpunpckldq_avx(auVar3,auVar4);
  auVar7 = vpunpckldq_avx(auVar5,auVar6);
  auVar19 = vpunpckhdq_avx(auVar3,auVar4);
  auVar20 = vpunpckhdq_avx(auVar5,auVar6);
  auVar3 = vpunpckldq_avx(auVar1,auVar2);
  auVar4 = vpunpckldq_avx(auVar16,auVar17);
  auVar1 = vpunpckhdq_avx(auVar1,auVar2);
  auVar2 = vpunpckhdq_avx(auVar16,auVar17);
  auVar5 = vpunpcklqdq_avx(auVar18,auVar7);
  auVar16 = vpunpckhqdq_avx(auVar18,auVar7);
  auVar18 = vpunpcklqdq_avx(auVar19,auVar20);
  auVar17 = vpunpckhqdq_avx(auVar19,auVar20);
  auVar6 = vpunpcklqdq_avx(auVar4,auVar3);
  auVar19 = vpunpckhqdq_avx(auVar3,auVar4);
  auVar3 = vpunpcklqdq_avx(auVar1,auVar2);
  auVar20 = vpunpckhqdq_avx(auVar1,auVar2);
  auVar1 = vpalignr_avx(auVar16,auVar16,2);
  auVar2 = vpalignr_avx(auVar18,auVar18,4);
  auVar16 = vpalignr_avx(auVar17,auVar17,6);
  auVar17 = vpalignr_avx(auVar19,auVar19,10);
  auVar19 = vpalignr_avx(auVar3,auVar3,0xc);
  auVar20 = vpalignr_avx(auVar20,auVar20,0xe);
  auVar8 = vcvtph2ps_f16c(auVar5);
  auVar9 = vcvtph2ps_f16c(auVar1);
  auVar10 = vcvtph2ps_f16c(auVar2);
  auVar11 = vcvtph2ps_f16c(auVar16);
  auVar12 = vcvtph2ps_f16c(auVar6);
  auVar13 = vcvtph2ps_f16c(auVar17);
  auVar14 = vcvtph2ps_f16c(auVar19);
  auVar15 = vcvtph2ps_f16c(auVar20);
  *(undefined1 (*) [32])dst = auVar8;
  *(undefined1 (*) [32])(dst + 8) = auVar9;
  *(undefined1 (*) [32])(dst + 0x10) = auVar10;
  *(undefined1 (*) [32])(dst + 0x18) = auVar11;
  *(undefined1 (*) [32])(dst + 0x20) = auVar12;
  *(undefined1 (*) [32])(dst + 0x28) = auVar13;
  *(undefined1 (*) [32])(dst + 0x30) = auVar14;
  *(undefined1 (*) [32])(dst + 0x38) = auVar15;
  return;
}

Assistant:

void 
fromHalfZigZag_f16c (unsigned short *src, float *dst)
{
    #if defined IMF_HAVE_GCC_INLINEASM_64
        __asm__

           /* x3 <- 0                    
            * x8 <- [ 0- 7]              
            * x6 <- [56-63]              
            * x9 <- [21-28]              
            * x7 <- [28-35]              
            * x3 <- [ 6- 9] (lower half) */
          
          ("vpxor   %%xmm3,  %%xmm3, %%xmm3   \n"
           "vmovdqa    (%0), %%xmm8           \n"
           "vmovdqa 112(%0), %%xmm6           \n"
           "vmovdqu  42(%0), %%xmm9           \n"
           "vmovdqu  56(%0), %%xmm7           \n"
           "vmovq    12(%0), %%xmm3           \n"

           /* Setup rows 0-2 of A in xmm0-xmm2 
            * x1 <- x8 >> 16 (1 value)     
            * x2 <- x8 << 32 (2 values)    
            * x0 <- alignr([35-42], x8, 2) 
            * x1 <- blend(x1, [41-48])     
            * x2 <- blend(x2, [49-56])     */

           "vpsrldq      $2, %%xmm8, %%xmm1   \n"      
           "vpslldq      $4, %%xmm8, %%xmm2   \n"      
           "vpalignr     $2, 70(%0), %%xmm8, %%xmm0 \n"
           "vpblendw  $0xfc, 82(%0), %%xmm1, %%xmm1 \n"
           "vpblendw  $0x1f, 98(%0), %%xmm2, %%xmm2 \n"
     
           /* Setup rows 4-6 of A in xmm4-xmm6 
            * x4 <- x6 >> 32 (2 values)   
            * x5 <- x6 << 16 (1 value)    
            * x6 <- alignr(x6,x9,14)      
            * x4 <- blend(x4, [ 7-14])    
            * x5 <- blend(x5, [15-22])    */

           "vpsrldq      $4, %%xmm6, %%xmm4         \n"
           "vpslldq      $2, %%xmm6, %%xmm5         \n"
           "vpalignr    $14, %%xmm6, %%xmm9, %%xmm6 \n"
           "vpblendw  $0xf8, 14(%0), %%xmm4, %%xmm4 \n"
           "vpblendw  $0x3f, 30(%0), %%xmm5, %%xmm5 \n"

           /* Load the upper half of row 3 into xmm3 
            * x3 <- [54-57] (upper half) */

           "vpinsrq      $1, 108(%0), %%xmm3, %%xmm3\n"

           /* Reverse the even rows. We're not using PSHUFB as
            * that requires loading an extra constant all the time,
            * and we're alreadly pretty memory bound.
            */

           "vpshuflw $0x1b, %%xmm0, %%xmm0          \n" 
           "vpshuflw $0x1b, %%xmm2, %%xmm2          \n" 
           "vpshuflw $0x1b, %%xmm4, %%xmm4          \n" 
           "vpshuflw $0x1b, %%xmm6, %%xmm6          \n" 

           "vpshufhw $0x1b, %%xmm0, %%xmm0          \n" 
           "vpshufhw $0x1b, %%xmm2, %%xmm2          \n" 
           "vpshufhw $0x1b, %%xmm4, %%xmm4          \n" 
           "vpshufhw $0x1b, %%xmm6, %%xmm6          \n" 

           "vpshufd $0x4e, %%xmm0, %%xmm0          \n" 
           "vpshufd $0x4e, %%xmm2, %%xmm2          \n" 
           "vpshufd $0x4e, %%xmm4, %%xmm4          \n" 
           "vpshufd $0x4e, %%xmm6, %%xmm6          \n" 

           /* Transpose xmm0-xmm7 into xmm8-xmm15 */

           "vpunpcklwd %%xmm1, %%xmm0, %%xmm8       \n"
           "vpunpcklwd %%xmm3, %%xmm2, %%xmm9       \n"
           "vpunpcklwd %%xmm5, %%xmm4, %%xmm10      \n"
           "vpunpcklwd %%xmm7, %%xmm6, %%xmm11      \n"
           "vpunpckhwd %%xmm1, %%xmm0, %%xmm12      \n"
           "vpunpckhwd %%xmm3, %%xmm2, %%xmm13      \n"
           "vpunpckhwd %%xmm5, %%xmm4, %%xmm14      \n"
           "vpunpckhwd %%xmm7, %%xmm6, %%xmm15      \n"
     
           "vpunpckldq  %%xmm9,  %%xmm8, %%xmm0     \n"
           "vpunpckldq %%xmm11, %%xmm10, %%xmm1     \n"
           "vpunpckhdq  %%xmm9,  %%xmm8, %%xmm2     \n"
           "vpunpckhdq %%xmm11, %%xmm10, %%xmm3     \n"
           "vpunpckldq %%xmm13, %%xmm12, %%xmm4     \n"
           "vpunpckldq %%xmm15, %%xmm14, %%xmm5     \n"
           "vpunpckhdq %%xmm13, %%xmm12, %%xmm6     \n"
           "vpunpckhdq %%xmm15, %%xmm14, %%xmm7     \n"
     
           "vpunpcklqdq %%xmm1,  %%xmm0, %%xmm8     \n"
           "vpunpckhqdq %%xmm1,  %%xmm0, %%xmm9     \n"
           "vpunpcklqdq %%xmm3,  %%xmm2, %%xmm10    \n"
           "vpunpckhqdq %%xmm3,  %%xmm2, %%xmm11    \n"
           "vpunpcklqdq %%xmm4,  %%xmm5, %%xmm12    \n"
           "vpunpckhqdq %%xmm5,  %%xmm4, %%xmm13    \n"
           "vpunpcklqdq %%xmm7,  %%xmm6, %%xmm14    \n"
           "vpunpckhqdq %%xmm7,  %%xmm6, %%xmm15    \n"

           /* Rotate the rows to get the correct final order. 
            * Rotating xmm12 isn't needed, as we can handle
            * the rotation in the PUNPCKLQDQ above. Rotating
            * xmm8 isn't needed as it's already in the right order           
            */

           "vpalignr  $2,  %%xmm9,  %%xmm9,  %%xmm9 \n"
           "vpalignr  $4, %%xmm10, %%xmm10, %%xmm10 \n"
           "vpalignr  $6, %%xmm11, %%xmm11, %%xmm11 \n"
           "vpalignr $10, %%xmm13, %%xmm13, %%xmm13 \n"
           "vpalignr $12, %%xmm14, %%xmm14, %%xmm14 \n"
           "vpalignr $14, %%xmm15, %%xmm15, %%xmm15 \n"

            /* Convert from half -> float */

           "vcvtph2ps  %%xmm8, %%ymm8            \n"  
           "vcvtph2ps  %%xmm9, %%ymm9            \n"
           "vcvtph2ps %%xmm10, %%ymm10           \n"
           "vcvtph2ps %%xmm11, %%ymm11           \n"
           "vcvtph2ps %%xmm12, %%ymm12           \n"
           "vcvtph2ps %%xmm13, %%ymm13           \n"
           "vcvtph2ps %%xmm14, %%ymm14           \n"
           "vcvtph2ps %%xmm15, %%ymm15           \n"
           
           /* Move float values to dst */

           "vmovaps    %%ymm8,    (%1)           \n"
           "vmovaps    %%ymm9,  32(%1)           \n"
           "vmovaps   %%ymm10,  64(%1)           \n" 
           "vmovaps   %%ymm11,  96(%1)           \n" 
           "vmovaps   %%ymm12, 128(%1)           \n" 
           "vmovaps   %%ymm13, 160(%1)           \n" 
           "vmovaps   %%ymm14, 192(%1)           \n" 
           "vmovaps   %%ymm15, 224(%1)           \n"
        #ifndef __AVX__
            "vzeroupper                          \n"
        #endif /* __AVX__ */
            : /* Output  */                
            : /* Input   */ "r"(src), "r"(dst)
            : /* Clobber */ "memory",
        #ifndef __AVX__
                            "%xmm0",  "%xmm1",  "%xmm2",  "%xmm3", 
                            "%xmm4",  "%xmm5",  "%xmm6",  "%xmm7",
                            "%xmm8",  "%xmm9",  "%xmm10", "%xmm11",
                            "%xmm12", "%xmm13", "%xmm14", "%xmm15"
        #else
                            "%ymm0",  "%ymm1",  "%ymm2",  "%ymm3", 
                            "%ymm4",  "%ymm5",  "%ymm6",  "%ymm7",
                            "%ymm8",  "%ymm9",  "%ymm10", "%ymm11",
                            "%ymm12", "%ymm13", "%ymm14", "%ymm15"
        #endif /* __AVX__ */
        );

    #else
        fromHalfZigZag_scalar(src, dst);
    #endif /* defined IMF_HAVE_GCC_INLINEASM_64 */
}